

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boyer_moore.hpp
# Opt level: O3

__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::detail::
boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::find_nocase_(boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
               *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     begin,
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char *pcVar1;
  ctype<char> *pcVar2;
  char cVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  diff_type curpos;
  ulong uVar8;
  char *pcVar9;
  
  lVar6 = (long)end._M_current - (long)begin._M_current;
  uVar8 = (ulong)this->length_;
  uVar5 = uVar8;
  do {
    if (lVar6 <= (long)uVar8) {
      return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )end._M_current;
    }
    pcVar9 = begin._M_current + uVar5;
    begin._M_current = begin._M_current + uVar5;
    pcVar7 = this->last_;
    pcVar2 = (tr->super_cpp_regex_traits<char>).ctype_;
    cVar3 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)*pcVar9);
    pcVar9 = begin._M_current;
    if (cVar3 == *pcVar7) {
      do {
        if (pcVar7 == this->begin_) {
          return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )pcVar9;
        }
        pcVar2 = (tr->super_cpp_regex_traits<char>).ctype_;
        cVar3 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)pcVar9[-1]);
        pcVar1 = pcVar7 + -1;
        pcVar7 = pcVar7 + -1;
        pcVar9 = pcVar9 + -1;
      } while (cVar3 == *pcVar1);
    }
    pcVar2 = (tr->super_cpp_regex_traits<char>).ctype_;
    bVar4 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)*begin._M_current);
    uVar5 = (ulong)this->offsets_[bVar4];
    uVar8 = uVar8 + uVar5;
  } while( true );
}

Assistant:

BidiIter find_nocase_(BidiIter begin, BidiIter end, Traits const &tr) const
    {
        typedef typename boost::iterator_difference<BidiIter>::type diff_type;
        diff_type const endpos = std::distance(begin, end);
        diff_type offset = static_cast<diff_type>(this->length_);

        for(diff_type curpos = offset; curpos < endpos; curpos += offset)
        {
            std::advance(begin, offset);

            char_type const *pat_tmp = this->last_;
            BidiIter str_tmp = begin;

            for(; tr.translate_nocase(*str_tmp) == *pat_tmp; --pat_tmp, --str_tmp)
            {
                if(pat_tmp == this->begin_)
                {
                    return str_tmp;
                }
            }

            offset = this->offsets_[tr.hash(tr.translate_nocase(*begin))];
        }

        return end;
    }